

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O0

void __thiscall Vault::Client::Client(Client *this,Client *other,Token *token)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Token *token_local;
  Client *other_local;
  Client *this_local;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_0026d970;
  iVar1 = (*other->_vptr_Client[4])();
  this->debug_ = SUB41(iVar1,0);
  iVar1 = (*other->_vptr_Client[5])();
  this->tls_ = SUB41(iVar1,0);
  (*other->_vptr_Client[6])();
  (*other->_vptr_Client[7])();
  Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->token_,token);
  (*other->_vptr_Client[9])();
  iVar1 = (*other->_vptr_Client[10])();
  HttpClient::HttpClient(&this->httpClient_,(HttpClient *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*other->_vptr_Client[0xb])();
  this->authStrategy_ = (AuthenticationStrategy *)CONCAT44(extraout_var_00,iVar1);
  (*other->_vptr_Client[0xc])(&this->caBundle_);
  return;
}

Assistant:

Vault::Client::Client(const Vault::Client &other, Vault::Token token)
    : debug_(other.getDebug())
    , tls_(other.getTls())
    , host_(other.getHost())
    , port_(other.getPort())
    , token_(std::move(token))
    , namespace_(other.getNamespace())
    , httpClient_(other.getHttpClient())
    , authStrategy_(other.getAuthenticationStrategy())
    , caBundle_(other.getCaBundle()) {}